

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.h
# Opt level: O0

void __thiscall
slang::ast::EvalContext::EvalContext
          (EvalContext *this,ASTContext *astCtx,bitmask<slang::ast::EvalFlags> flags)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 in_DL;
  undefined8 *in_RSI;
  undefined8 *in_RDI;
  SourceRange *this_00;
  
  in_RDI[6] = in_RSI[6];
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[2];
  uVar4 = in_RSI[3];
  uVar5 = in_RSI[5];
  in_RDI[4] = in_RSI[4];
  in_RDI[5] = uVar5;
  in_RDI[2] = uVar3;
  in_RDI[3] = uVar4;
  *in_RDI = uVar1;
  in_RDI[1] = uVar2;
  *(undefined1 *)(in_RDI + 7) = in_DL;
  *(undefined4 *)((long)in_RDI + 0x3c) = 0;
  in_RDI[8] = 0;
  in_RDI[9] = 0;
  this_00 = (SourceRange *)(in_RDI + 10);
  SmallVector<slang::ast::EvalContext::Frame,_2UL>::SmallVector
            ((SmallVector<slang::ast::EvalContext::Frame,_2UL> *)0x38dc3d);
  SmallVector<slang::ast::LValue_*,_5UL>::SmallVector
            ((SmallVector<slang::ast::LValue_*,_5UL> *)0x38dc53);
  Diagnostics::Diagnostics((Diagnostics *)0x38dc69);
  Diagnostics::Diagnostics((Diagnostics *)0x38dc7f);
  SourceRange::SourceRange(this_00);
  *(undefined1 *)(in_RDI + 0x69) = 0;
  return;
}

Assistant:

explicit EvalContext(const ASTContext& astCtx, bitmask<EvalFlags> flags = {}) :
        astCtx(astCtx), flags(flags) {}